

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O1

int __thiscall
QGraphicsLinearLayout::stretchFactor(QGraphicsLinearLayout *this,QGraphicsLayoutItem *item)

{
  QGraphicsLayoutItemPrivate *pQVar1;
  int iVar2;
  
  if (item != (QGraphicsLayoutItem *)0x0) {
    pQVar1 = (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
    iVar2 = QGraphicsGridLayoutEngine::stretchFactor
                      ((QGraphicsGridLayoutEngine *)(pQVar1[1].cachedSizeHints + 1),item,
                       *(Orientation *)((long)&pQVar1[1].cachedSizeHints[0].wd + 4));
    return iVar2;
  }
  stretchFactor();
  return 0;
}

Assistant:

int QGraphicsLinearLayout::stretchFactor(QGraphicsLayoutItem *item) const
{
    Q_D(const QGraphicsLinearLayout);
    if (!item) {
        qWarning("QGraphicsLinearLayout::setStretchFactor: cannot return"
                 " a stretch factor for a null item");
        return 0;
    }
    return d->engine.stretchFactor(item, d->orientation);
}